

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::InputScalar(char *label,ImGuiDataType data_type,void *data_ptr,void *step,
                       void *step_fast,char *format,ImGuiInputTextFlags flags)

{
  bool bVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  void *in_RCX;
  void *in_RDX;
  ImGuiDataType in_ESI;
  char *in_RDI;
  void *in_R8;
  float _x;
  float fVar4;
  char *in_stack_00000018;
  char *in_stack_00000020;
  ImGuiButtonFlags button_flags;
  float button_size;
  bool value_changed;
  char buf [64];
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  void *in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  void *in_stack_ffffffffffffff18;
  ImGuiInputTextCallback in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  ImGuiInputTextFlags flags_00;
  void *arg2;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  char *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff4c;
  char *in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  bool local_99;
  ImGuiButtonFlags in_stack_ffffffffffffffac;
  ImVec2 *size_arg;
  ImGuiContext *label_00;
  bool local_1;
  
  flags_00 = (ImGuiInputTextFlags)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  pIVar3 = GetCurrentWindow();
  if ((pIVar3->SkipItems & 1U) == 0) {
    size_arg = (ImVec2 *)&GImGui->Style;
    label_00 = GImGui;
    DataTypeFormatString
              (in_stack_ffffffffffffff08,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20),
               (ImGuiDataType)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(char *)0x188953);
    local_99 = false;
    if (in_RCX == (void *)0x0) {
      bVar1 = InputText(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                        CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),flags_00,
                        in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      if (bVar1) {
        local_99 = DataTypeApplyOpFromText
                             ((char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                              in_stack_ffffffffffffff50,(ImGuiDataType)in_stack_ffffffffffffff4c,
                              in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      }
    }
    else {
      _x = GetFrameHeight();
      BeginGroup();
      PushID((char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      fVar4 = CalcItemWidth();
      fVar2 = -(_x + size_arg[9].y);
      ImMax<float>(1.0,fVar2 + fVar2 + fVar4);
      PushItemWidth((float)((ulong)in_stack_ffffffffffffff00 >> 0x20));
      bVar1 = InputText(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                        CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),flags_00,
                        in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      if (bVar1) {
        local_99 = DataTypeApplyOpFromText
                             ((char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                              in_stack_ffffffffffffff50,(ImGuiDataType)in_stack_ffffffffffffff4c,
                              in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      }
      PopItemWidth();
      SameLine((float)((ulong)in_stack_ffffffffffffff00 >> 0x20),(float)in_stack_ffffffffffffff00);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff54,_x,_x);
      bVar1 = ButtonEx(&label_00->Initialized,size_arg,in_stack_ffffffffffffffac);
      if (bVar1) {
        arg2 = in_RCX;
        if ((((label_00->IO).KeyCtrl & 1U) != 0) && (in_R8 != (void *)0x0)) {
          arg2 = in_R8;
        }
        DataTypeApplyOp(in_ESI,0x2d,in_RDX,in_RDX,arg2);
        local_99 = true;
      }
      SameLine((float)((ulong)in_stack_ffffffffffffff00 >> 0x20),(float)in_stack_ffffffffffffff00);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff4c,_x,_x);
      bVar1 = ButtonEx(&label_00->Initialized,size_arg,in_stack_ffffffffffffffac);
      if (bVar1) {
        if ((((label_00->IO).KeyCtrl & 1U) != 0) && (in_R8 != (void *)0x0)) {
          in_RCX = in_R8;
        }
        DataTypeApplyOp(in_ESI,0x2b,in_RDX,in_RDX,in_RCX);
        local_99 = true;
      }
      SameLine((float)((ulong)in_stack_ffffffffffffff00 >> 0x20),(float)in_stack_ffffffffffffff00);
      FindRenderedTextEnd(in_RDI,(char *)0x0);
      TextUnformatted(in_stack_00000020,in_stack_00000018);
      PopID();
      EndGroup();
    }
    local_1 = local_99;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::InputScalar(const char* label, ImGuiDataType data_type, void* data_ptr, const void* step, const void* step_fast, const char* format, ImGuiInputTextFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    IM_ASSERT(data_type >= 0 && data_type < ImGuiDataType_COUNT);
    if (format == NULL)
        format = GDataTypeInfo[data_type].PrintFmt;

    char buf[64];
    DataTypeFormatString(buf, IM_ARRAYSIZE(buf), data_type, data_ptr, format);

    bool value_changed = false;
    if ((flags & (ImGuiInputTextFlags_CharsHexadecimal | ImGuiInputTextFlags_CharsScientific)) == 0)
        flags |= ImGuiInputTextFlags_CharsDecimal;
    flags |= ImGuiInputTextFlags_AutoSelectAll;

    if (step != NULL)
    {
        const float button_size = GetFrameHeight();

        BeginGroup(); // The only purpose of the group here is to allow the caller to query item data e.g. IsItemActive()
        PushID(label);
        PushItemWidth(ImMax(1.0f, CalcItemWidth() - (button_size + style.ItemInnerSpacing.x) * 2));
        if (InputText("", buf, IM_ARRAYSIZE(buf), flags)) // PushId(label) + "" gives us the expected ID from outside point of view
            value_changed = DataTypeApplyOpFromText(buf, g.InputTextState.InitialText.Data, data_type, data_ptr, format);
        PopItemWidth();

        // Step buttons
        ImGuiButtonFlags button_flags = ImGuiButtonFlags_Repeat | ImGuiButtonFlags_DontClosePopups;
        if (flags & ImGuiInputTextFlags_ReadOnly)
            button_flags |= ImGuiButtonFlags_Disabled;
        SameLine(0, style.ItemInnerSpacing.x);
        if (ButtonEx("-", ImVec2(button_size, button_size), button_flags))
        {
            DataTypeApplyOp(data_type, '-', data_ptr, data_ptr, g.IO.KeyCtrl && step_fast ? step_fast : step);
            value_changed = true;
        }
        SameLine(0, style.ItemInnerSpacing.x);
        if (ButtonEx("+", ImVec2(button_size, button_size), button_flags))
        {
            DataTypeApplyOp(data_type, '+', data_ptr, data_ptr, g.IO.KeyCtrl && step_fast ? step_fast : step);
            value_changed = true;
        }
        SameLine(0, style.ItemInnerSpacing.x);
        TextUnformatted(label, FindRenderedTextEnd(label));

        PopID();
        EndGroup();
    }
    else
    {
        if (InputText(label, buf, IM_ARRAYSIZE(buf), flags))
            value_changed = DataTypeApplyOpFromText(buf, g.InputTextState.InitialText.Data, data_type, data_ptr, format);
    }

    return value_changed;
}